

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

void __thiscall tetgenmesh::point2tetorg(tetgenmesh *this,point pa,triface *searchtet)

{
  tetrahedron ptr;
  triface *searchtet_local;
  point pa_local;
  tetgenmesh *this_local;
  
  ptr = point2tet(this,pa);
  decode(this,ptr,searchtet);
  if (searchtet->tet[4] == (tetrahedron)pa) {
    searchtet->ver = 0xb;
  }
  else if (searchtet->tet[5] == (tetrahedron)pa) {
    searchtet->ver = 3;
  }
  else if (searchtet->tet[6] == (tetrahedron)pa) {
    searchtet->ver = 7;
  }
  else {
    searchtet->ver = 0;
  }
  return;
}

Assistant:

inline void tetgenmesh::point2tetorg(point pa, triface& searchtet)
{
  decode(point2tet(pa), searchtet);
  if ((point) searchtet.tet[4] == pa) {
    searchtet.ver = 11;
  } else if ((point) searchtet.tet[5] == pa) {
    searchtet.ver = 3;
  } else if ((point) searchtet.tet[6] == pa) {
    searchtet.ver = 7;
  } else {
    searchtet.ver = 0;
  }
}